

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_data_skip(archive_read *a)

{
  uint *puVar1;
  int64_t iVar2;
  int local_2c;
  int ret;
  int64_t bytes_skipped;
  rar *rar;
  archive_read *a_local;
  
  puVar1 = (uint *)a->format->data;
  if (0 < *(long *)(puVar1 + 0x28)) {
    __archive_read_consume(a,*(int64_t *)(puVar1 + 0x28));
    puVar1[0x28] = 0;
    puVar1[0x29] = 0;
  }
  if ((*(long *)(puVar1 + 0x2a) < 1) ||
     (iVar2 = __archive_read_consume(a,*(int64_t *)(puVar1 + 0x2a)), -1 < iVar2)) {
    if (((*puVar1 & 1) == 0) || ((puVar1[6] & 2) == 0)) {
      a_local._4_4_ = 0;
    }
    else {
      local_2c = archive_read_format_rar_read_header(a,a->entry);
      if (local_2c == 1) {
        local_2c = archive_read_format_rar_read_header(a,a->entry);
      }
      if (local_2c == 0) {
        a_local._4_4_ = archive_read_format_rar_read_data_skip(a);
      }
      else {
        a_local._4_4_ = local_2c;
      }
    }
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_rar_read_data_skip(struct archive_read *a)
{
  struct rar *rar;
  int64_t bytes_skipped;
  int ret;

  rar = (struct rar *)(a->format->data);

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->bytes_remaining > 0) {
    bytes_skipped = __archive_read_consume(a, rar->bytes_remaining);
    if (bytes_skipped < 0)
      return (ARCHIVE_FATAL);
  }

  /* Compressed data to skip must be read from each header in a multivolume
   * archive.
   */
  if (rar->main_flags & MHD_VOLUME && rar->file_flags & FHD_SPLIT_AFTER)
  {
    ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret == (ARCHIVE_EOF))
      ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret != (ARCHIVE_OK))
      return ret;
    return archive_read_format_rar_read_data_skip(a);
  }

  return (ARCHIVE_OK);
}